

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::doAddClique
          (HighsCliqueTable *this,CliqueVar *cliquevars,HighsInt numcliquevars,bool equality,
          HighsInt origin)

{
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_00;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *this_01;
  int *piVar1;
  CliqueVar CVar2;
  CliqueVar CVar3;
  pointer piVar4;
  pointer pCVar5;
  bool bVar6;
  uint uVar7;
  iterator __position;
  pointer pCVar8;
  pointer pCVar9;
  int iVar10;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> pVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  HighsInt i;
  ulong uVar15;
  HighsInt cliqueid;
  HighsInt k;
  CliqueVar v;
  CliqueVar CStack_64;
  int local_50;
  
  piVar4 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar4) {
    iVar13 = (int)(((long)(this->cliques).
                          super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->cliques).
                         super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x14);
    cliqueid = iVar13;
    std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::emplace_back<>
              (&this->cliques);
  }
  else {
    iVar13 = piVar4[-1];
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4 + -1;
    cliqueid = iVar13;
  }
  pCVar8 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar8[iVar13].equality = equality;
  pCVar8[iVar13].origin = origin;
  this_00 = &this->freespaces;
  if ((this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00275802:
    local_50 = (int)((ulong)((long)(this->cliqueentries).
                                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->cliqueentries).
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
    pCVar8[iVar13].start = local_50;
    local_50 = local_50 + numcliquevars;
    pCVar8[iVar13].end = local_50;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
              (&this->cliqueentries,(long)local_50);
    pCVar8 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    k = pCVar8[iVar13].start;
  }
  else {
    _v = (pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>)
         ((ulong)(uint)numcliquevars | 0xffffffff00000000);
    __position = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::lower_bound(&this_00->_M_t,(key_type *)&v);
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->freespaces)._M_t._M_impl.super__Rb_tree_header) {
      pCVar8 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00275802;
    }
    k = *(HighsInt *)&__position._M_node[1].field_0x4;
    local_50 = __position._M_node[1]._M_color + k;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)this_00,(const_iterator)__position._M_node);
    pCVar8 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar8[iVar13].start = k;
    pCVar8[iVar13].end = numcliquevars + k;
  }
  pCVar8[iVar13].numZeroFixed = 0;
  this_01 = &this->infeasvertexstack;
  bVar6 = false;
  for (uVar15 = 0; uVar15 != (uint)numcliquevars; uVar15 = uVar15 + 1) {
    v = cliquevars[uVar15];
    resolveSubstitution(this,&v);
    if (bVar6) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      push_back(this_01,&v);
      bVar6 = true;
    }
    else {
      uVar7 = (int)v << 1 | (uint)((int)((uint)v ^ 0x80000000) < 0);
      if (numcliquevars == 2) {
        bVar6 = HighsHashTree<int,_void>::contains
                          ((this->invertedHashListSizeTwo).
                           super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)uVar7,&cliqueid);
        if (bVar6) {
LAB_00275906:
          uVar14 = (ulong)(this->cliques).
                          super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                          ._M_impl.super__Vector_impl_data._M_start[cliqueid].start;
          lVar12 = uVar14 << 2;
          for (; (int)uVar14 != k; uVar14 = (ulong)((int)uVar14 + 1)) {
            pCVar5 = (this->cliqueentries).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((((uint)v ^ *(uint *)(&pCVar5->field_0x0 + lVar12)) & 0x7fffffff) != 0) {
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::push_back(this_01,(value_type *)(&pCVar5->field_0x0 + lVar12));
            }
            unlink(this,(char *)(uVar14 & 0xffffffff));
            lVar12 = lVar12 + 4;
          }
          k = (this->cliques).
              super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
              ._M_impl.super__Vector_impl_data._M_start[cliqueid].start;
          bVar6 = true;
          goto LAB_002759d0;
        }
        bVar6 = HighsHashTree<int,void>::insert<int&>
                          ((HighsHashTree<int,void> *)
                           ((this->invertedHashListSizeTwo).
                            super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           (int)((int)v << 1 | (uint)((int)v < 0))),&cliqueid);
      }
      else {
        bVar6 = HighsHashTree<int,_int>::contains
                          ((this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)uVar7,&cliqueid);
        if (bVar6) goto LAB_00275906;
        bVar6 = HighsHashTree<int,int>::insert<int&,int&>
                          ((HighsHashTree<int,int> *)
                           ((this->invertedHashList).
                            super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           (int)((int)v << 1 | (uint)((int)v < 0))),&cliqueid,&k);
      }
      if (bVar6 == false) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        push_back(this_01,&v);
      }
      else {
        (this->cliqueentries).
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_start[k] = v;
        piVar1 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)((int)v << 1 | (uint)((int)v < 0));
        *piVar1 = *piVar1 + 1;
        k = k + 1;
      }
      bVar6 = false;
    }
LAB_002759d0:
  }
  if (k < local_50) {
    if (local_50 ==
        (int)((ulong)((long)(this->cliqueentries).
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->cliqueentries).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::resize
                (&this->cliqueentries,(long)k);
    }
    else {
      v = (CliqueVar)(local_50 - k);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_emplace_unique<int,int&>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)this_00,(int *)&v,&k);
    }
    pCVar8 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (k < pCVar8[cliqueid].end) {
      pCVar9 = pCVar8 + cliqueid;
      uVar7 = pCVar9->start;
      if (k - uVar7 != 2) {
        if (k - uVar7 == 1) {
          unlink(this,(char *)(ulong)uVar7);
          pCVar8 = (this->cliques).
                   super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCVar8[cliqueid].start = -1;
          pCVar8[cliqueid].end = -1;
        }
        else {
          if (k != uVar7) {
            pCVar9->end = k;
            goto LAB_00275b1c;
          }
          pCVar9->start = -1;
          pCVar8[cliqueid].end = -1;
        }
        std::vector<int,_std::allocator<int>_>::push_back(&this->freeslots,&cliqueid);
        return;
      }
      unlink(this,(char *)(ulong)uVar7);
      unlink(this,(char *)(ulong)((this->cliques).
                                  super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                  ._M_impl.super__Vector_impl_data._M_start[cliqueid].start + 1));
      pCVar8 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar8[cliqueid].end = k;
      link(this,(char *)(ulong)(uint)pCVar8[cliqueid].start,(char *)(long)cliqueid);
      link(this,(char *)(ulong)((this->cliques).
                                super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                ._M_impl.super__Vector_impl_data._M_start[cliqueid].start + 1),
           (char *)(long)cliqueid);
    }
  }
LAB_00275b1c:
  pCVar8 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar13 = pCVar8[cliqueid].start;
  iVar10 = pCVar8[cliqueid].end - iVar13;
  this->numEntries = this->numEntries + iVar10;
  if (iVar10 == 2) {
    pCVar5 = (this->cliqueentries).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_start;
    CVar2 = pCVar5[iVar13];
    CVar3 = pCVar5[(long)iVar13 + 1];
    pVar11.second = CVar2;
    pVar11.first = CVar3;
    _v = (pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>)
         ((long)pVar11 << 0x20 | (ulong)(uint)CVar2);
    if (((uint)CVar3 & 0x7fffffff) < ((uint)CVar2 & 0x7fffffff)) {
      _v = pVar11;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
    insert<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
              ((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>
                *)&this->sizeTwoCliques,
               (pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)&v,&cliqueid);
  }
  return;
}

Assistant:

void HighsCliqueTable::doAddClique(const CliqueVar* cliquevars,
                                   HighsInt numcliquevars, bool equality,
                                   HighsInt origin) {
  HighsInt cliqueid;

  if (freeslots.empty()) {
    cliqueid = cliques.size();
    cliques.emplace_back();
  } else {
    cliqueid = freeslots.back();
    freeslots.pop_back();
  }

  cliques[cliqueid].equality = equality;
  cliques[cliqueid].origin = origin;

  std::set<std::pair<HighsInt, int>>::iterator it;
  HighsInt maxEnd;
  if (freespaces.empty() || (it = freespaces.lower_bound(std::make_pair(
                                 numcliquevars, -1))) == freespaces.end()) {
    cliques[cliqueid].start = cliqueentries.size();
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].end;
    cliqueentries.resize(cliques[cliqueid].end);
  } else {
    std::pair<HighsInt, int> freespace = *it;
    freespaces.erase(it);

    cliques[cliqueid].start = freespace.second;
    cliques[cliqueid].end = cliques[cliqueid].start + numcliquevars;
    maxEnd = cliques[cliqueid].start + freespace.first;
  }

  cliques[cliqueid].numZeroFixed = 0;

  bool fixtozero = false;
  HighsInt k = cliques[cliqueid].start;
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    CliqueVar v = cliquevars[i];

    resolveSubstitution(v);

    if (fixtozero) {
      infeasvertexstack.push_back(v);
      continue;
    }

    // due to substitutions the variable may occur together with its complement
    // in this clique and we can fix all other variables in the clique to zero:
    //          x + ~x + ... <= 1
    //   <=> x + 1 - x + ... <= 1
    //   <=>             ... <= 0
    bool clqHasVCompl =
        numcliquevars == 2
            ? invertedHashListSizeTwo[v.complement().index()].contains(cliqueid)
            : invertedHashList[v.complement().index()].contains(cliqueid);

    if (clqHasVCompl) {
      fixtozero = true;
      for (HighsInt j = cliques[cliqueid].start; j != k; ++j) {
        if (cliqueentries[j].col != v.col)
          infeasvertexstack.push_back(cliqueentries[j]);
        unlink(j, cliqueid);
      }
      k = cliques[cliqueid].start;
      continue;
    }

    // due to substitutions the variable may occur twice in this clique and
    // we can fix it to zero:  x + x + ... <= 1  <=>  2x <= 1 <=> x <= 0.5 <=>
    // x = 0
    bool inserted;
    if (numcliquevars == 2)
      inserted = invertedHashListSizeTwo[v.index()].insert(cliqueid);
    else
      inserted = invertedHashList[v.index()].insert(cliqueid, k);

    if (!inserted) {
      infeasvertexstack.push_back(v);
      continue;
    }

    cliqueentries[k] = v;
    ++numcliquesvar[v.index()];
    ++k;
  }

  if (maxEnd > k) {
    if (int(cliqueentries.size()) == maxEnd)
      cliqueentries.resize(k);
    else
      freespaces.emplace(maxEnd - k, k);

    if (cliques[cliqueid].end > k) {
      switch (k - cliques[cliqueid].start) {
        case 0:
          // clique empty, so just mark it as deleted
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 1:
          // size 1 clique is redundant, so unlink the single linked entry
          // and mark it as deleted
          unlink(cliques[cliqueid].start, cliqueid);
          cliques[cliqueid].start = -1;
          cliques[cliqueid].end = -1;
          freeslots.push_back(cliqueid);
          return;
        case 2:
          // due to substitutions the clique became smaller and is now of size
          // two as a result we need to link it to the size two cliqueset
          // instead of the normal cliqueset
          assert(cliqueid >= 0 && cliqueid < (HighsInt)cliques.size());
          assert(cliques[cliqueid].start >= 0 &&
                 cliques[cliqueid].start < (HighsInt)cliqueentries.size());
          unlink(cliques[cliqueid].start, cliqueid);
          unlink(cliques[cliqueid].start + 1, cliqueid);

          cliques[cliqueid].end = k;

          link(cliques[cliqueid].start, cliqueid);
          link(cliques[cliqueid].start + 1, cliqueid);
          break;
        default:
          cliques[cliqueid].end = k;
      }
    }
  }

  HighsInt cliqueLen = cliques[cliqueid].end - cliques[cliqueid].start;
  numEntries += cliqueLen;
  if (cliqueLen == 2)
    sizeTwoCliques.insert(
        sortedEdge(cliqueentries[cliques[cliqueid].start],
                   cliqueentries[cliques[cliqueid].start + 1]),
        cliqueid);
}